

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfusionstyle.cpp
# Opt level: O0

QSize __thiscall
QFusionStyle::sizeFromContents
          (QFusionStyle *this,ContentsType type,QStyleOption *option,QSize *size,QWidget *widget)

{
  bool bVar1;
  int iVar2;
  QSize QVar3;
  QStyleOptionButton *pQVar4;
  QStyleOptionMenuItem *pQVar5;
  ulong uVar6;
  QComboBox *pQVar7;
  QStyleOption *in_RDX;
  undefined4 in_ESI;
  long *in_RDI;
  undefined8 in_R8;
  long in_FS_OFFSET;
  qreal qVar8;
  qreal qVar9;
  QCommonStyle *unaff_retaddr;
  QComboBox *combo;
  int checkcol;
  qreal dpi;
  int w;
  QStyleOptionMenuItem *menuItem;
  int topMargin;
  int horizontalMargin;
  QStyleOptionButton *btn;
  QFontMetricsF fmBold;
  QFontMetricsF fm;
  QSize newSize;
  QFont fontBold;
  int in_stack_fffffffffffffea8;
  CaseSensitivity in_stack_fffffffffffffeac;
  QSize *in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffebc;
  QChar c;
  int *this_00;
  int local_a4;
  int local_a0;
  int local_9c;
  QSize local_98;
  int local_90;
  int local_8c;
  undefined1 *local_88;
  undefined1 *local_80;
  QChar local_72 [29];
  int local_38;
  int local_34 [5];
  QSize *in_stack_ffffffffffffffe8;
  QStyleOption *in_stack_fffffffffffffff0;
  long lVar10;
  
  c.ucs = (char16_t)((uint)in_stack_fffffffffffffebc >> 0x10);
  lVar10 = *(long *)(in_FS_OFFSET + 0x28);
  QVar3 = QCommonStyle::sizeFromContents
                    (unaff_retaddr,(ContentsType)((ulong)lVar10 >> 0x20),in_stack_fffffffffffffff0,
                     in_stack_ffffffffffffffe8,(QWidget *)&DAT_aaaaaaaaaaaaaaaa);
  switch(in_ESI) {
  case 0:
    pQVar4 = qstyleoption_cast<QStyleOptionButton_const*>(in_RDX);
    if (pQVar4 != (QStyleOptionButton *)0x0) {
      (**(code **)(*in_RDI + 0xe0))(in_RDI,0,pQVar4,0);
      QSize::QSize(in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac,in_stack_fffffffffffffea8);
      QSize::operator+=(in_stack_fffffffffffffeb0,
                        (QSize *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
      bVar1 = QString::isEmpty((QString *)0x4f4563);
      if ((!bVar1) && (iVar2 = QSize::width((QSize *)0x4f4574), iVar2 < 0x50)) {
        QSize::setWidth(in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac);
      }
      uVar6 = QIcon::isNull();
      if (((uVar6 & 1) == 0) && (iVar2 = QSize::height((QSize *)0x4f45ab), 0x10 < iVar2)) {
        QSize::QSize(in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac,in_stack_fffffffffffffea8);
        QSize::operator-=(in_stack_fffffffffffffeb0,
                          (QSize *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
      }
    }
    break;
  case 1:
  case 2:
    QSize::QSize(in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac,in_stack_fffffffffffffea8);
    QSize::operator+=(in_stack_fffffffffffffeb0,
                      (QSize *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
    break;
  case 3:
    QSize::QSize(in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac,in_stack_fffffffffffffea8);
    QSize::operator+=(in_stack_fffffffffffffeb0,
                      (QSize *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
    break;
  case 4:
    QSize::QSize(in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac,in_stack_fffffffffffffea8);
    QSize::operator+=(in_stack_fffffffffffffeb0,
                      (QSize *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
    break;
  default:
    break;
  case 7:
    pQVar5 = qstyleoption_cast<QStyleOptionMenuItem_const*>(in_RDX);
    if (pQVar5 != (QStyleOptionMenuItem *)0x0) {
      QSize::width((QSize *)0x4f47c1);
      QChar::QChar<char16_t,_true>(local_72,L'\t');
      bVar1 = QString::contains((QString *)in_stack_fffffffffffffeb0,c,in_stack_fffffffffffffeac);
      if (!bVar1) {
        if (pQVar5->menuItemType == SubMenu) {
          QStyleHelper::dpiScaled
                    ((qreal)in_stack_fffffffffffffeb0,
                     (QStyleOption *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
        }
        else if (pQVar5->menuItemType == DefaultItem) {
          local_80 = &DAT_aaaaaaaaaaaaaaaa;
          QFontMetricsF::QFontMetricsF((QFontMetricsF *)&local_80,&pQVar5->font);
          QFont::QFont((QFont *)&stack0xffffffffffffffe8,&pQVar5->font);
          QFont::setBold((QFont *)in_stack_fffffffffffffeb0,
                         SUB41(in_stack_fffffffffffffeac >> 0x18,0));
          local_88 = &DAT_aaaaaaaaaaaaaaaa;
          QFontMetricsF::QFontMetricsF((QFontMetricsF *)&local_88,(QFont *)&stack0xffffffffffffffe8)
          ;
          QFontMetricsF::horizontalAdvance((QString *)&local_88,(int)pQVar5 + 0x60);
          QFontMetricsF::horizontalAdvance((QString *)&local_80,(int)pQVar5 + 0x60);
          qCeil<double>(2.56721598455264e-317);
          QFontMetricsF::~QFontMetricsF((QFontMetricsF *)&local_88);
          QFont::~QFont((QFont *)&stack0xffffffffffffffe8);
          QFontMetricsF::~QFontMetricsF((QFontMetricsF *)&local_80);
        }
      }
      qVar8 = QStyleHelper::dpi((QStyleOption *)
                                CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
      this_00 = &pQVar5->maxIconWidth;
      qVar9 = QStyleHelper::dpiScaled(12.0,qVar8);
      local_8c = (int)qVar9;
      qMax<int>(this_00,&local_8c);
      QStyleHelper::dpiScaled(25.0,qVar8);
      QSize::setWidth(in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac);
      if (pQVar5->menuItemType == Separator) {
        bVar1 = QString::isEmpty((QString *)0x4f4a34);
        if (!bVar1) {
          QFontMetrics::height();
          QSize::setHeight(in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac);
        }
      }
      else {
        uVar6 = QIcon::isNull();
        if (((uVar6 & 1) == 0) &&
           (pQVar7 = qobject_cast<QComboBox_const*>((QObject *)0x4f4a76), pQVar7 != (QComboBox *)0x0
           )) {
          local_98 = QComboBox::iconSize((QComboBox *)this_00);
          local_90 = QSize::height((QSize *)0x4f4aa2);
          local_90 = local_90 + 2;
          local_9c = QSize::height((QSize *)0x4f4ab9);
          qMax<int>(&local_90,&local_9c);
          QSize::setHeight(in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac);
        }
      }
      QSize::width((QSize *)0x4f4af5);
      QStyleHelper::dpiScaled(12.0,qVar8);
      QSize::setWidth(in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac);
      local_a0 = QSize::width((QSize *)0x4f4b30);
      qVar8 = QStyleHelper::dpiScaled(120.0,qVar8);
      local_a4 = (int)qVar8;
      qMax<int>(&local_a0,&local_a4);
      QSize::setWidth(in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac);
    }
    break;
  case 8:
    QSize::QSize(in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac,in_stack_fffffffffffffea8);
    QSize::operator+=(in_stack_fffffffffffffeb0,
                      (QSize *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
    break;
  case 0xe:
    QSize::QSize(in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac,in_stack_fffffffffffffea8);
    QSize::operator+=(in_stack_fffffffffffffeb0,
                      (QSize *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
    break;
  case 0xf:
    QSize::QSize(in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac,in_stack_fffffffffffffea8);
    QSize::operator+=(in_stack_fffffffffffffeb0,
                      (QSize *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
    break;
  case 0x10:
    QSize::QSize(in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac,in_stack_fffffffffffffea8);
    QSize::operator+=(in_stack_fffffffffffffeb0,
                      (QSize *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
    break;
  case 0x14:
    if (in_RDX != (QStyleOption *)0x0) {
      local_34[0] = (**(code **)(*in_RDI + 0xe0))(in_RDI,0x26,in_RDX,in_R8);
      local_38 = QFontMetrics::height();
      qMax<int>(local_34,&local_38);
      QSize::QSize(in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac,in_stack_fffffffffffffea8);
      QSize::operator+=(in_stack_fffffffffffffeb0,
                        (QSize *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
    }
    break;
  case 0x15:
    QSize::QSize(in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac,in_stack_fffffffffffffea8);
    QSize::operator-=(in_stack_fffffffffffffeb0,
                      (QSize *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar10) {
    return QVar3;
  }
  __stack_chk_fail();
}

Assistant:

QSize QFusionStyle::sizeFromContents(ContentsType type, const QStyleOption *option,
                                     const QSize &size, const QWidget *widget) const
{
    QSize newSize = QCommonStyle::sizeFromContents(type, option, size, widget);
    switch (type) {
    case CT_PushButton:
        if (const QStyleOptionButton *btn = qstyleoption_cast<const QStyleOptionButton *>(option)) {
            const int horizontalMargin = pixelMetric(PM_ButtonMargin, btn);
            newSize += QSize(horizontalMargin, 0);
            if (!btn->text.isEmpty() && newSize.width() < 80)
                newSize.setWidth(80);
            if (!btn->icon.isNull() && btn->iconSize.height() > 16)
                newSize -= QSize(0, 2);
        }
        break;
    case CT_GroupBox:
        if (option) {
            int topMargin = qMax(pixelMetric(PM_IndicatorHeight, option, widget), option->fontMetrics.height()) + groupBoxTopMargin;
            newSize += QSize(10, topMargin); // Add some space below the groupbox
        }
        break;
    case CT_RadioButton:
    case CT_CheckBox:
        newSize += QSize(0, 1);
        break;
    case CT_ToolButton:
        newSize += QSize(2, 2);
        break;
    case CT_SpinBox:
        newSize += QSize(0, -3);
        break;
    case CT_ComboBox:
        newSize += QSize(2, 4);
        break;
    case CT_LineEdit:
        newSize += QSize(0, 4);
        break;
    case CT_MenuBarItem:
        newSize += QSize(8, 5);
        break;
    case CT_MenuItem:
        if (const QStyleOptionMenuItem *menuItem = qstyleoption_cast<const QStyleOptionMenuItem *>(option)) {
            int w = size.width(); // Don't rely of QCommonStyle's width calculation here
            if (menuItem->text.contains(u'\t'))
                w += menuItem->reservedShortcutWidth;
            else if (menuItem->menuItemType == QStyleOptionMenuItem::SubMenu)
                w += 2 * QStyleHelper::dpiScaled(QFusionStylePrivate::menuArrowHMargin, option);
            else if (menuItem->menuItemType == QStyleOptionMenuItem::DefaultItem) {
                const QFontMetricsF fm(menuItem->font);
                QFont fontBold = menuItem->font;
                fontBold.setBold(true);
                const QFontMetricsF fmBold(fontBold);
                w += qCeil(fmBold.horizontalAdvance(menuItem->text) - fm.horizontalAdvance(menuItem->text));
            }
            const qreal dpi = QStyleHelper::dpi(option);
             // Windows always shows a check column
            const int checkcol = qMax<int>(menuItem->maxIconWidth,
                                           QStyleHelper::dpiScaled(QFusionStylePrivate::menuCheckMarkWidth, dpi));
            w += checkcol + windowsItemFrame;
            w += QStyleHelper::dpiScaled(int(QFusionStylePrivate::menuRightBorder) + 10, dpi);
            newSize.setWidth(w);
            if (menuItem->menuItemType == QStyleOptionMenuItem::Separator) {
                if (!menuItem->text.isEmpty()) {
                    newSize.setHeight(menuItem->fontMetrics.height());
                }
            }
            else if (!menuItem->icon.isNull()) {
#if QT_CONFIG(combobox)
                if (const QComboBox *combo = qobject_cast<const QComboBox*>(widget)) {
                    newSize.setHeight(qMax(combo->iconSize().height() + 2, newSize.height()));
                }
#endif
            }
            newSize.setWidth(newSize.width() + int(QStyleHelper::dpiScaled(12, dpi)));
            newSize.setWidth(qMax<int>(newSize.width(), int(QStyleHelper::dpiScaled(120, dpi))));
        }
        break;
    case CT_SizeGrip:
        newSize += QSize(4, 4);
        break;
    case CT_MdiControls:
        newSize -= QSize(1, 0);
        break;
    default:
        break;
    }
    return newSize;
}